

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glesv2_gears.c
# Opt level: O0

gears_t_conflict1 * glesv2_gears_init(int win_width,int win_height)

{
  GLuint GVar1;
  int iVar2;
  gears_t_conflict1 *gears_00;
  void *pvVar3;
  _func_void_GLuint_GLuint *p_Var4;
  _func_void_GLuint_GLuint_GLchar_ptr *p_Var5;
  _func_void_GLenum_GLuint *p_Var6;
  _func_void_GLenum_GLsizeiptr_GLvoid_ptr_GLenum *p_Var7;
  _func_void_GLbitfield *p_Var8;
  _func_void_GLfloat_GLfloat_GLfloat_GLfloat *p_Var9;
  _func_void_GLuint *p_Var10;
  _func_GLuint_varargs *p_Var11;
  _func_GLuint_GLenum *p_Var12;
  _func_void_GLsizei_GLuint_ptr *p_Var13;
  _func_void_GLenum_GLint_GLsizei *p_Var14;
  _func_void_GLenum *p_Var15;
  _func_GLenum_varargs *p_Var16;
  _func_void_GLuint_GLsizei_GLsizei_ptr_GLchar_ptr *p_Var17;
  _func_void_GLuint_GLenum_GLint_ptr *p_Var18;
  _func_GLubyte_ptr_GLenum *p_Var19;
  _func_int_GLuint_GLchar_ptr *p_Var20;
  _func_void_GLuint_GLsizei_GLchar_ptr_ptr_GLint_ptr *p_Var21;
  _func_void_GLint_GLint *p_Var22;
  _func_void_GLint_GLsizei_GLfloat_ptr *p_Var23;
  _func_void_GLint_GLsizei_GLboolean_GLfloat_ptr *p_Var24;
  _func_void_GLenum_GLint_GLint_GLsizei_GLsizei_GLint_GLenum_GLenum_GLvoid_ptr *p_Var25;
  _func_void_GLenum_GLenum_GLint *p_Var26;
  _func_void_GLuint_GLint_GLenum_GLboolean_GLsizei_GLvoid_ptr *p_Var27;
  _func_void_GLint_GLint_GLsizei_GLsizei *p_Var28;
  GLubyte *pGVar29;
  char *pcVar30;
  uchar *image_data;
  float zFar;
  float zNear;
  void *texture_data;
  int texture_height;
  int texture_width;
  GLuint fragShader;
  GLuint vertShader;
  GLchar *log;
  GLchar **ppGStack_390;
  GLint params;
  GLchar *code;
  char fragShaderSource [347];
  char vertShaderSource [512];
  gears_t_conflict1 *gears;
  int win_height_local;
  int win_width_local;
  
  memcpy(fragShaderSource + 0x158,
         "attribute vec3 a_Position;\nattribute vec3 a_Normal;\nattribute vec2 a_TexCoord;\nuniform vec4 u_LightPos;\nuniform mat4 u_ModelViewProjectionMatrix;\nuniform mat4 u_NormalMatrix;\nuniform vec4 u_Color;\nvarying vec4 v_Color;\nvarying vec2 v_TexCoord;\n\nvoid main(void)\n{\n  gl_Position = u_ModelViewProjectionMatrix * vec4(a_Position, 1);\n  v_Color = u_Color * vec4(0.2, 0.2, 0.2, 1) + u_Color * max(dot(normalize(u_LightPos.xyz), normalize(vec3(u_NormalMatrix * vec4(a_Normal, 1)))), 0.0);\n  v_TexCoord = a_TexCoord;\n}\n"
         ,0x200);
  memcpy(&code,
         "precision mediump float;\nuniform int u_TextureEnable;\nuniform sampler2D u_Texture;\nvarying vec4 v_Color;\nvarying vec2 v_TexCoord;\n\nvoid main()\n{\n  if (u_TextureEnable == 1) {\n    vec4 t = texture2D(u_Texture, v_TexCoord);\n    if (t.a == 0.0)\n      gl_FragColor = v_Color;\n    else\n      gl_FragColor = t;\n  }\n  else\n    gl_FragColor = v_Color;\n}\n"
         ,0x15b);
  texture_width = 0;
  texture_height = 0;
  gears_00 = (gears_t_conflict1 *)calloc(1,0x1b8);
  if (gears_00 == (gears_t_conflict1 *)0x0) {
    printf("calloc gears failed\n");
    return (gears_t_conflict1 *)0x0;
  }
  pvVar3 = (void *)dlopen("libGL.so.1",1);
  gears_00->lib_handle = pvVar3;
  if (gears_00->lib_handle == (void *)0x0) {
    printf("%s library not found\n","libGL.so.1");
    goto LAB_0010f3ce;
  }
  p_Var4 = (_func_void_GLuint_GLuint *)dlsym(gears_00->lib_handle,"glAttachShader");
  gears_00->glAttachShader = p_Var4;
  if (gears_00->glAttachShader == (_func_void_GLuint_GLuint *)0x0) {
    printf("%s not found\n","glAttachShader");
    goto LAB_0010f3ce;
  }
  p_Var5 = (_func_void_GLuint_GLuint_GLchar_ptr *)dlsym(gears_00->lib_handle,"glBindAttribLocation")
  ;
  gears_00->glBindAttribLocation = p_Var5;
  if (gears_00->glBindAttribLocation == (_func_void_GLuint_GLuint_GLchar_ptr *)0x0) {
    printf("%s not found\n","glBindAttribLocation");
    goto LAB_0010f3ce;
  }
  p_Var6 = (_func_void_GLenum_GLuint *)dlsym(gears_00->lib_handle,"glBindBuffer");
  gears_00->glBindBuffer = p_Var6;
  if (gears_00->glBindBuffer == (_func_void_GLenum_GLuint *)0x0) {
    printf("%s not found\n","glBindBuffer");
    goto LAB_0010f3ce;
  }
  p_Var7 = (_func_void_GLenum_GLsizeiptr_GLvoid_ptr_GLenum *)
           dlsym(gears_00->lib_handle,"glBufferData");
  gears_00->glBufferData = p_Var7;
  if (gears_00->glBufferData == (_func_void_GLenum_GLsizeiptr_GLvoid_ptr_GLenum *)0x0) {
    printf("%s not found\n","glBufferData");
    goto LAB_0010f3ce;
  }
  p_Var8 = (_func_void_GLbitfield *)dlsym(gears_00->lib_handle,"glClear");
  gears_00->glClear = p_Var8;
  if (gears_00->glClear == (_func_void_GLbitfield *)0x0) {
    printf("%s not found\n","glClear");
    goto LAB_0010f3ce;
  }
  p_Var9 = (_func_void_GLfloat_GLfloat_GLfloat_GLfloat *)dlsym(gears_00->lib_handle,"glClearColor");
  gears_00->glClearColor = p_Var9;
  if (gears_00->glClearColor == (_func_void_GLfloat_GLfloat_GLfloat_GLfloat *)0x0) {
    printf("%s not found\n","glClearColor");
    goto LAB_0010f3ce;
  }
  p_Var10 = (_func_void_GLuint *)dlsym(gears_00->lib_handle,"glCompileShader");
  gears_00->glCompileShader = p_Var10;
  if (gears_00->glCompileShader == (_func_void_GLuint *)0x0) {
    printf("%s not found\n","glCompileShader");
    goto LAB_0010f3ce;
  }
  p_Var11 = (_func_GLuint_varargs *)dlsym(gears_00->lib_handle,"glCreateProgram");
  gears_00->glCreateProgram = p_Var11;
  if (gears_00->glCreateProgram == (_func_GLuint_varargs *)0x0) {
    printf("%s not found\n","glCreateProgram");
    goto LAB_0010f3ce;
  }
  p_Var12 = (_func_GLuint_GLenum *)dlsym(gears_00->lib_handle,"glCreateShader");
  gears_00->glCreateShader = p_Var12;
  if (gears_00->glCreateShader == (_func_GLuint_GLenum *)0x0) {
    printf("%s not found\n","glCreateShader");
    goto LAB_0010f3ce;
  }
  p_Var13 = (_func_void_GLsizei_GLuint_ptr *)dlsym(gears_00->lib_handle,"glDeleteBuffers");
  gears_00->glDeleteBuffers = p_Var13;
  if (gears_00->glDeleteBuffers == (_func_void_GLsizei_GLuint_ptr *)0x0) {
    printf("%s not found\n","glDeleteBuffers");
    goto LAB_0010f3ce;
  }
  p_Var10 = (_func_void_GLuint *)dlsym(gears_00->lib_handle,"glDeleteShader");
  gears_00->glDeleteShader = p_Var10;
  if (gears_00->glDeleteShader == (_func_void_GLuint *)0x0) {
    printf("%s not found\n","glDeleteShader");
    goto LAB_0010f3ce;
  }
  p_Var10 = (_func_void_GLuint *)dlsym(gears_00->lib_handle,"glDeleteProgram");
  gears_00->glDeleteProgram = p_Var10;
  if (gears_00->glDeleteProgram == (_func_void_GLuint *)0x0) {
    printf("%s not found\n","glDeleteProgram");
    goto LAB_0010f3ce;
  }
  p_Var10 = (_func_void_GLuint *)dlsym(gears_00->lib_handle,"glDisableVertexAttribArray");
  gears_00->glDisableVertexAttribArray = p_Var10;
  if (gears_00->glDisableVertexAttribArray == (_func_void_GLuint *)0x0) {
    printf("%s not found\n","glDisableVertexAttribArray");
    goto LAB_0010f3ce;
  }
  p_Var14 = (_func_void_GLenum_GLint_GLsizei *)dlsym(gears_00->lib_handle,"glDrawArrays");
  gears_00->glDrawArrays = p_Var14;
  if (gears_00->glDrawArrays == (_func_void_GLenum_GLint_GLsizei *)0x0) {
    printf("%s not found\n","glDrawArrays");
    goto LAB_0010f3ce;
  }
  p_Var15 = (_func_void_GLenum *)dlsym(gears_00->lib_handle,"glEnable");
  gears_00->glEnable = p_Var15;
  if (gears_00->glEnable == (_func_void_GLenum *)0x0) {
    printf("%s not found\n","glEnable");
    goto LAB_0010f3ce;
  }
  p_Var10 = (_func_void_GLuint *)dlsym(gears_00->lib_handle,"glEnableVertexAttribArray");
  gears_00->glEnableVertexAttribArray = p_Var10;
  if (gears_00->glEnableVertexAttribArray == (_func_void_GLuint *)0x0) {
    printf("%s not found\n","glEnableVertexAttribArray");
    goto LAB_0010f3ce;
  }
  p_Var13 = (_func_void_GLsizei_GLuint_ptr *)dlsym(gears_00->lib_handle,"glGenBuffers");
  gears_00->glGenBuffers = p_Var13;
  if (gears_00->glGenBuffers == (_func_void_GLsizei_GLuint_ptr *)0x0) {
    printf("%s not found\n","glGenBuffers");
    goto LAB_0010f3ce;
  }
  p_Var16 = (_func_GLenum_varargs *)dlsym(gears_00->lib_handle,"glGetError");
  gears_00->glGetError = p_Var16;
  if (gears_00->glGetError == (_func_GLenum_varargs *)0x0) {
    printf("%s not found\n","glGetError");
    goto LAB_0010f3ce;
  }
  p_Var17 = (_func_void_GLuint_GLsizei_GLsizei_ptr_GLchar_ptr *)
            dlsym(gears_00->lib_handle,"glGetProgramInfoLog");
  gears_00->glGetProgramInfoLog = p_Var17;
  if (gears_00->glGetProgramInfoLog == (_func_void_GLuint_GLsizei_GLsizei_ptr_GLchar_ptr *)0x0) {
    printf("%s not found\n","glGetProgramInfoLog");
    goto LAB_0010f3ce;
  }
  p_Var18 = (_func_void_GLuint_GLenum_GLint_ptr *)dlsym(gears_00->lib_handle,"glGetProgramiv");
  gears_00->glGetProgramiv = p_Var18;
  if (gears_00->glGetProgramiv == (_func_void_GLuint_GLenum_GLint_ptr *)0x0) {
    printf("%s not found\n","glGetProgramiv");
    goto LAB_0010f3ce;
  }
  p_Var17 = (_func_void_GLuint_GLsizei_GLsizei_ptr_GLchar_ptr *)
            dlsym(gears_00->lib_handle,"glGetShaderInfoLog");
  gears_00->glGetShaderInfoLog = p_Var17;
  if (gears_00->glGetShaderInfoLog == (_func_void_GLuint_GLsizei_GLsizei_ptr_GLchar_ptr *)0x0) {
    printf("%s not found\n","glGetShaderInfoLog");
    goto LAB_0010f3ce;
  }
  p_Var18 = (_func_void_GLuint_GLenum_GLint_ptr *)dlsym(gears_00->lib_handle,"glGetShaderiv");
  gears_00->glGetShaderiv = p_Var18;
  if (gears_00->glGetShaderiv == (_func_void_GLuint_GLenum_GLint_ptr *)0x0) {
    printf("%s not found\n","glGetShaderiv");
    goto LAB_0010f3ce;
  }
  p_Var19 = (_func_GLubyte_ptr_GLenum *)dlsym(gears_00->lib_handle,"glGetString");
  gears_00->glGetString = p_Var19;
  if (gears_00->glGetString == (_func_GLubyte_ptr_GLenum *)0x0) {
    printf("%s not found\n","glGetString");
    goto LAB_0010f3ce;
  }
  p_Var20 = (_func_int_GLuint_GLchar_ptr *)dlsym(gears_00->lib_handle,"glGetUniformLocation");
  gears_00->glGetUniformLocation = p_Var20;
  if (gears_00->glGetUniformLocation == (_func_int_GLuint_GLchar_ptr *)0x0) {
    printf("%s not found\n","glGetUniformLocation");
    goto LAB_0010f3ce;
  }
  p_Var10 = (_func_void_GLuint *)dlsym(gears_00->lib_handle,"glLinkProgram");
  gears_00->glLinkProgram = p_Var10;
  if (gears_00->glLinkProgram == (_func_void_GLuint *)0x0) {
    printf("%s not found\n","glLinkProgram");
    goto LAB_0010f3ce;
  }
  p_Var21 = (_func_void_GLuint_GLsizei_GLchar_ptr_ptr_GLint_ptr *)
            dlsym(gears_00->lib_handle,"glShaderSource");
  gears_00->glShaderSource = p_Var21;
  if (gears_00->glShaderSource == (_func_void_GLuint_GLsizei_GLchar_ptr_ptr_GLint_ptr *)0x0) {
    printf("%s not found\n","glShaderSource");
    goto LAB_0010f3ce;
  }
  p_Var22 = (_func_void_GLint_GLint *)dlsym(gears_00->lib_handle,"glUniform1i");
  gears_00->glUniform1i = p_Var22;
  if (gears_00->glUniform1i == (_func_void_GLint_GLint *)0x0) {
    printf("%s not found\n","glUniform1i");
    goto LAB_0010f3ce;
  }
  p_Var23 = (_func_void_GLint_GLsizei_GLfloat_ptr *)dlsym(gears_00->lib_handle,"glUniform4fv");
  gears_00->glUniform4fv = p_Var23;
  if (gears_00->glUniform4fv == (_func_void_GLint_GLsizei_GLfloat_ptr *)0x0) {
    printf("%s not found\n","glUniform4fv");
    goto LAB_0010f3ce;
  }
  p_Var24 = (_func_void_GLint_GLsizei_GLboolean_GLfloat_ptr *)
            dlsym(gears_00->lib_handle,"glUniformMatrix4fv");
  gears_00->glUniformMatrix4fv = p_Var24;
  if (gears_00->glUniformMatrix4fv == (_func_void_GLint_GLsizei_GLboolean_GLfloat_ptr *)0x0) {
    printf("%s not found\n","glUniformMatrix4fv");
    goto LAB_0010f3ce;
  }
  p_Var10 = (_func_void_GLuint *)dlsym(gears_00->lib_handle,"glUseProgram");
  gears_00->glUseProgram = p_Var10;
  if (gears_00->glUseProgram == (_func_void_GLuint *)0x0) {
    printf("%s not found\n","glUseProgram");
    goto LAB_0010f3ce;
  }
  p_Var25 = (_func_void_GLenum_GLint_GLint_GLsizei_GLsizei_GLint_GLenum_GLenum_GLvoid_ptr *)
            dlsym(gears_00->lib_handle,"glTexImage2D");
  gears_00->glTexImage2D = p_Var25;
  if (gears_00->glTexImage2D ==
      (_func_void_GLenum_GLint_GLint_GLsizei_GLsizei_GLint_GLenum_GLenum_GLvoid_ptr *)0x0) {
    printf("%s not found\n","glTexImage2D");
    goto LAB_0010f3ce;
  }
  p_Var26 = (_func_void_GLenum_GLenum_GLint *)dlsym(gears_00->lib_handle,"glTexParameteri");
  gears_00->glTexParameteri = p_Var26;
  if (gears_00->glTexParameteri == (_func_void_GLenum_GLenum_GLint *)0x0) {
    printf("%s not found\n","glTexParameteri");
    goto LAB_0010f3ce;
  }
  p_Var27 = (_func_void_GLuint_GLint_GLenum_GLboolean_GLsizei_GLvoid_ptr *)
            dlsym(gears_00->lib_handle,"glVertexAttribPointer");
  gears_00->glVertexAttribPointer = p_Var27;
  if (gears_00->glVertexAttribPointer ==
      (_func_void_GLuint_GLint_GLenum_GLboolean_GLsizei_GLvoid_ptr *)0x0) {
    printf("%s not found\n","glVertexAttribPointer");
    goto LAB_0010f3ce;
  }
  p_Var28 = (_func_void_GLint_GLint_GLsizei_GLsizei *)dlsym(gears_00->lib_handle,"glViewport");
  gears_00->glViewport = p_Var28;
  if (gears_00->glViewport == (_func_void_GLint_GLint_GLsizei_GLsizei *)0x0) {
    printf("%s not found\n","glViewport");
    goto LAB_0010f3ce;
  }
  (*gears_00->glEnable)(0xb71);
  GVar1 = (*gears_00->glCreateProgram)();
  gears_00->program = GVar1;
  if (gears_00->program == 0) {
    printf("glCreateProgram failed\n");
    goto LAB_0010f3ce;
  }
  texture_width = (*gears_00->glCreateShader)(0x8b31);
  if (texture_width == 0) {
    printf("glCreateShader vertex failed\n");
    goto LAB_0010f3ce;
  }
  ppGStack_390 = (GLchar **)(fragShaderSource + 0x158);
  (*gears_00->glShaderSource)(texture_width,1,(GLchar **)&stack0xfffffffffffffc70,(GLint *)0x0);
  (*gears_00->glCompileShader)(texture_width);
  (*gears_00->glGetShaderiv)(texture_width,0x8b81,(GLint *)((long)&log + 4));
  if (log._4_4_ == 0) {
    (*gears_00->glGetShaderiv)(texture_width,0x8b84,(GLint *)((long)&log + 4));
    _fragShader = (GLchar *)calloc(1,(long)log._4_4_);
    if (_fragShader == (GLchar *)0x0) {
      printf("calloc log failed\n");
    }
    else {
      (*gears_00->glGetShaderInfoLog)(texture_width,log._4_4_,(GLsizei *)0x0,_fragShader);
      printf("glCompileShader vertex failed: %s",_fragShader);
      free(_fragShader);
    }
    goto LAB_0010f3ce;
  }
  (*gears_00->glAttachShader)(gears_00->program,texture_width);
  texture_height = (*gears_00->glCreateShader)(0x8b30);
  if (texture_height == 0) {
    printf("glCreateShader fragment failed\n");
    goto LAB_0010f3ce;
  }
  ppGStack_390 = &code;
  pGVar29 = (*gears_00->glGetString)(0x8b8c);
  pcVar30 = strstr((char *)pGVar29,"1.20");
  if (pcVar30 == (char *)0x0) {
    pGVar29 = (*gears_00->glGetString)(0x8b8c);
    pcVar30 = strstr((char *)pGVar29,"1.30");
    if (pcVar30 != (char *)0x0) goto LAB_0010ee98;
  }
  else {
LAB_0010ee98:
    ppGStack_390 = (GLchar **)((long)ppGStack_390 + 0x19);
  }
  (*gears_00->glShaderSource)(texture_height,1,(GLchar **)&stack0xfffffffffffffc70,(GLint *)0x0);
  (*gears_00->glCompileShader)(texture_height);
  (*gears_00->glGetShaderiv)(texture_height,0x8b81,(GLint *)((long)&log + 4));
  if (log._4_4_ == 0) {
    (*gears_00->glGetShaderiv)(texture_height,0x8b84,(GLint *)((long)&log + 4));
    _fragShader = (GLchar *)calloc(1,(long)log._4_4_);
    if (_fragShader == (GLchar *)0x0) {
      printf("calloc log failed\n");
    }
    else {
      (*gears_00->glGetShaderInfoLog)(texture_height,log._4_4_,(GLsizei *)0x0,_fragShader);
      printf("glCompileShader fragment failed: %s",_fragShader);
      free(_fragShader);
    }
  }
  else {
    (*gears_00->glAttachShader)(gears_00->program,texture_height);
    (*gears_00->glBindAttribLocation)(gears_00->program,0,"a_Position");
    (*gears_00->glBindAttribLocation)(gears_00->program,1,"a_Normal");
    (*gears_00->glBindAttribLocation)(gears_00->program,2,"a_TexCoord");
    (*gears_00->glLinkProgram)(gears_00->program);
    (*gears_00->glGetProgramiv)(gears_00->program,0x8b82,(GLint *)((long)&log + 4));
    if (log._4_4_ == 0) {
      (*gears_00->glGetProgramiv)(gears_00->program,0x8b84,(GLint *)((long)&log + 4));
      _fragShader = (GLchar *)calloc(1,(long)log._4_4_);
      if (_fragShader == (GLchar *)0x0) {
        printf("calloc log failed\n");
      }
      else {
        (*gears_00->glGetProgramInfoLog)(gears_00->program,log._4_4_,(GLsizei *)0x0,_fragShader);
        printf("glLinkProgram failed: %s",_fragShader);
        free(_fragShader);
      }
    }
    else {
      (*gears_00->glDeleteShader)(texture_height);
      (*gears_00->glDeleteShader)(texture_width);
      texture_height = 0;
      texture_width = 0;
      pcVar30 = getenv("TEXTURE");
      image_load(pcVar30,(uchar *)0x0,(int *)((long)&texture_data + 4),(int *)&texture_data);
      image_data = (uchar *)malloc((long)(texture_data._4_4_ * (int)texture_data * 4));
      if (image_data == (uchar *)0x0) {
        printf("malloc texture_data failed\n");
      }
      else {
        pcVar30 = getenv("TEXTURE");
        image_load(pcVar30,image_data,(int *)((long)&texture_data + 4),(int *)&texture_data);
        (*gears_00->glTexImage2D)
                  (0xde1,0,0x1908,texture_data._4_4_,(int)texture_data,0,0x1908,0x1401,image_data);
        free(image_data);
        (*gears_00->glTexParameteri)(0xde1,0x2801,0x2601);
        (*gears_00->glTexParameteri)(0xde1,0x2800,0x2601);
        (*gears_00->glUseProgram)(gears_00->program);
        (*gears_00->glClearColor)(0.0,0.0,0.0,1.0);
        (*gears_00->glViewport)(0,0,win_width,win_height);
        iVar2 = create_gear(gears_00,0,1.0,4.0,1.0,0x14,0.7);
        if (((iVar2 == 0) && (iVar2 = create_gear(gears_00,1,0.5,2.0,2.0,10,0.7), iVar2 == 0)) &&
           (iVar2 = create_gear(gears_00,2,1.3,2.0,0.5,10,0.7), iVar2 == 0)) {
          memset(gears_00->Projection,0,0x40);
          gears_00->Projection[0] = 5.0;
          gears_00->Projection[5] = ((float)win_width / (float)win_height) * 5.0;
          gears_00->Projection[10] = -1.1818181;
          gears_00->Projection[0xb] = -1.0;
          gears_00->Projection[0xe] = -10.909091;
          return gears_00;
        }
      }
    }
  }
LAB_0010f3ce:
  if (texture_height != 0) {
    (*gears_00->glDeleteShader)(texture_height);
  }
  if (texture_width != 0) {
    (*gears_00->glDeleteShader)(texture_width);
  }
  glesv2_gears_term(gears_00);
  return (gears_t_conflict1 *)0x0;
}

Assistant:

static gears_t *glesv2_gears_init(int win_width, int win_height)
{
  gears_t *gears = NULL;
  const char vertShaderSource[] = {
    #include "vert.xxd"
  };
  const char fragShaderSource[] = {
    #include "frag.xxd"
  };
  const GLchar *code;
  GLint params;
  GLchar *log;
  GLuint vertShader = 0;
  GLuint fragShader = 0;
  int texture_width, texture_height;
  void *texture_data = NULL;
  const float zNear = 5, zFar = 60;

  gears = calloc(1, sizeof(gears_t));
  if (!gears) {
    printf("calloc gears failed\n");
    return NULL;
  }

  gears->lib_handle = dlopen(GLESV2_LIB, RTLD_LAZY);
  if (!gears->lib_handle) {
    printf("%s library not found\n", GLESV2_LIB);
    goto out;
  }

  #define DLSYM(sym) gears->sym = dlsym(gears->lib_handle, #sym); \
  if (!gears->sym) { \
    printf("%s not found\n", #sym); \
    goto out; \
  }

  DLSYM(glAttachShader);
  DLSYM(glBindAttribLocation);
  DLSYM(glBindBuffer);
  DLSYM(glBufferData);
  DLSYM(glClear);
  DLSYM(glClearColor);
  DLSYM(glCompileShader);
  DLSYM(glCreateProgram);
  DLSYM(glCreateShader);
  DLSYM(glDeleteBuffers);
  DLSYM(glDeleteShader);
  DLSYM(glDeleteProgram);
  DLSYM(glDisableVertexAttribArray);
  DLSYM(glDrawArrays);
  DLSYM(glEnable);
  DLSYM(glEnableVertexAttribArray);
  DLSYM(glGenBuffers);
  DLSYM(glGetError);
  DLSYM(glGetProgramInfoLog);
  DLSYM(glGetProgramiv);
  DLSYM(glGetShaderInfoLog);
  DLSYM(glGetShaderiv);
  DLSYM(glGetString);
  DLSYM(glGetUniformLocation);
  DLSYM(glLinkProgram);
  DLSYM(glShaderSource);
  DLSYM(glUniform1i);
  DLSYM(glUniform4fv);
  DLSYM(glUniformMatrix4fv);
  DLSYM(glUseProgram);
  DLSYM(glTexImage2D);
  DLSYM(glTexParameteri);
  DLSYM(glVertexAttribPointer);
  DLSYM(glViewport);

  gears->glEnable(GL_DEPTH_TEST);

  gears->program = gears->glCreateProgram();
  if (!gears->program) {
    printf("glCreateProgram failed\n");
    goto out;
  }

  /* vertex shader */

  vertShader = gears->glCreateShader(GL_VERTEX_SHADER);
  if (!vertShader) {
    printf("glCreateShader vertex failed\n");
    goto out;
  }

  code = vertShaderSource;
  gears->glShaderSource(vertShader, 1, &code, NULL);

  gears->glCompileShader(vertShader);
  gears->glGetShaderiv(vertShader, GL_COMPILE_STATUS, &params);
  if (!params) {
    gears->glGetShaderiv(vertShader, GL_INFO_LOG_LENGTH, &params);
    log = calloc(1, params);
    if (!log) {
      printf("calloc log failed\n");
      goto out;
    }
    gears->glGetShaderInfoLog(vertShader, params, NULL, log);
    printf("glCompileShader vertex failed: %s", log);
    free(log);
    goto out;
  }

  gears->glAttachShader(gears->program, vertShader);

  /* fragment shader */

  fragShader = gears->glCreateShader(GL_FRAGMENT_SHADER);
  if (!fragShader) {
    printf("glCreateShader fragment failed\n");
    goto out;
  }

  code = fragShaderSource;
  if (strstr((char *)gears->glGetString(GL_SHADING_LANGUAGE_VERSION), "1.20") ||
      strstr((char *)gears->glGetString(GL_SHADING_LANGUAGE_VERSION), "1.30")) {
    code += strlen("precision mediump float;\n");
  }
  gears->glShaderSource(fragShader, 1, &code, NULL);

  gears->glCompileShader(fragShader);
  gears->glGetShaderiv(fragShader, GL_COMPILE_STATUS, &params);
  if (!params) {
    gears->glGetShaderiv(fragShader, GL_INFO_LOG_LENGTH, &params);
    log = calloc(1, params);
    if (!log) {
      printf("calloc log failed\n");
      goto out;
    }
    gears->glGetShaderInfoLog(fragShader, params, NULL, log);
    printf("glCompileShader fragment failed: %s", log);
    free(log);
    goto out;
  }

  gears->glAttachShader(gears->program, fragShader);

  /* link and use program */

  gears->glBindAttribLocation(gears->program, 0, "a_Position");
  gears->glBindAttribLocation(gears->program, 1, "a_Normal");
  gears->glBindAttribLocation(gears->program, 2, "a_TexCoord");

  gears->glLinkProgram(gears->program);
  gears->glGetProgramiv(gears->program, GL_LINK_STATUS, &params);
  if (!params) {
    gears->glGetProgramiv(gears->program, GL_INFO_LOG_LENGTH, &params);
    log = calloc(1, params);
    if (!log) {
      printf("calloc log failed\n");
      goto out;
    }
    gears->glGetProgramInfoLog(gears->program, params, NULL, log);
    printf("glLinkProgram failed: %s", log);
    free(log);
    goto out;
  }

  /* destroy shaders */

  gears->glDeleteShader(fragShader);
  gears->glDeleteShader(vertShader);
  vertShader = fragShader = 0;

  /* load texture */

  image_load(getenv("TEXTURE"), NULL, &texture_width, &texture_height);

  texture_data = malloc(texture_width * texture_height * 4);
  if (!texture_data) {
    printf("malloc texture_data failed\n");
    goto out;
  }

  image_load(getenv("TEXTURE"), texture_data, &texture_width, &texture_height);

  gears->glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, texture_width, texture_height, 0, GL_RGBA, GL_UNSIGNED_BYTE, texture_data);

  free(texture_data);

  gears->glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
  gears->glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);

  /* install program, set clear values, set viewport */

  gears->glUseProgram(gears->program);

  gears->glClearColor(0, 0, 0, 1);

  gears->glViewport(0, 0, win_width, win_height);

  /* create gears */

  if (create_gear(gears, GEAR0, 1.0, 4.0, 1.0, 20, 0.7)) {
    goto out;
  }

  if (create_gear(gears, GEAR1, 0.5, 2.0, 2.0, 10, 0.7)) {
    goto out;
  }

  if (create_gear(gears, GEAR2, 1.3, 2.0, 0.5, 10, 0.7)) {
    goto out;
  }

  memset(gears->Projection, 0, sizeof(gears->Projection));
  gears->Projection[0] = zNear;
  gears->Projection[5] = (float)win_width/win_height * zNear;
  gears->Projection[10] = -(zFar + zNear) / (zFar - zNear);
  gears->Projection[11] = -1;
  gears->Projection[14] = -2 * zFar * zNear / (zFar - zNear);

  return gears;

out:
  if (fragShader) {
    gears->glDeleteShader(fragShader);
  }
  if (vertShader) {
    gears->glDeleteShader(vertShader);
  }
  glesv2_gears_term(gears);
  return NULL;
}